

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::create_group_ops
          (DeconvolutionDepthWise_x86_fma *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  ulong uVar6;
  uint i;
  pointer ppLVar7;
  Layer *pLVar8;
  pointer ppLVar9;
  uint uVar10;
  int iVar11;
  void *in_R8;
  void *pvVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  ParamDict pd;
  int local_17c;
  Mat local_178;
  void *local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  size_t sStack_120;
  int iStack_118;
  Allocator *local_110;
  uint local_108;
  undefined4 uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint uStack_f8;
  long local_f0;
  int local_e4;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_e0;
  long local_d8;
  Allocator *local_d0;
  size_t local_c8;
  ulong local_c0;
  Mat local_b8;
  long local_70;
  Mat *local_68;
  size_t local_60;
  Option *local_58;
  ModelBinFromMatArray local_50;
  ParamDict local_40;
  
  iVar1 = (this->super_DeconvolutionDepthWise).num_output;
  iVar11 = (this->super_DeconvolutionDepthWise).kernel_h *
           (this->super_DeconvolutionDepthWise).kernel_w;
  iVar2 = (this->super_DeconvolutionDepthWise).group;
  uVar6 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)iVar2;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)iVar11;
  ppLVar9 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppLVar7 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_58 = opt;
  if (0 < (int)((ulong)((long)ppLVar9 - (long)ppLVar7) >> 3)) {
    lVar14 = 0;
    do {
      if (ppLVar7[lVar14] != (Layer *)0x0) {
        (*ppLVar7[lVar14]->_vptr_Layer[1])();
        ppLVar7 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppLVar9 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)((ulong)((long)ppLVar9 - (long)ppLVar7) >> 3));
  }
  local_e0 = &this->group_ops;
  if (ppLVar9 != ppLVar7) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar7;
  }
  iVar3 = (this->super_DeconvolutionDepthWise).group;
  i = (this->super_DeconvolutionDepthWise).num_output / iVar3;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_e0,(long)iVar3);
  if (0 < (this->super_DeconvolutionDepthWise).group) {
    local_e4 = iVar11 * i *
               (((int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                      (long)(iVar1 / iVar2)) * iVar2) / iVar3);
    local_60 = (size_t)local_e4;
    local_70 = (long)(int)i;
    local_68 = &(this->super_DeconvolutionDepthWise).activation_params;
    lVar14 = 0;
    do {
      local_178.elemsize = (this->super_DeconvolutionDepthWise).weight_data.elemsize;
      local_178.data =
           (void *)(lVar14 * local_60 * local_178.elemsize +
                   (long)(this->super_DeconvolutionDepthWise).weight_data.data);
      local_178.elempack = (this->super_DeconvolutionDepthWise).weight_data.elempack;
      local_178.allocator = (this->super_DeconvolutionDepthWise).weight_data.allocator;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.dims = 1;
      local_178.w = (int)local_60;
      local_178.h = 1;
      local_178.d = 1;
      local_178.c = 1;
      local_178.cstep = local_60;
      Mat::clone(&local_b8,(__fn *)&local_178,(void *)0x0,1,in_R8);
      piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if (local_178.data != (void *)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar15 = (this->super_DeconvolutionDepthWise).bias_term == 0;
      if (bVar15) {
        local_c0 = 0;
        local_d0 = (Allocator *)0x0;
        local_17c = 0;
        local_c8 = 0;
        pvVar12 = (void *)0x0;
        local_d8 = 0;
      }
      else {
        local_c8 = (this->super_DeconvolutionDepthWise).bias_data.elemsize;
        pvVar12 = (void *)(lVar14 * local_70 * local_c8 +
                          (long)(this->super_DeconvolutionDepthWise).bias_data.data);
        local_17c = (this->super_DeconvolutionDepthWise).bias_data.elempack;
        local_d0 = (this->super_DeconvolutionDepthWise).bias_data.allocator;
        local_c0 = (ulong)i;
        local_d8 = local_70;
      }
      uVar10 = (uint)!bVar15;
      pLVar8 = create_layer_cpu(8);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,(this->super_DeconvolutionDepthWise).kernel_w);
      ParamDict::set(&local_40,0xb,(this->super_DeconvolutionDepthWise).kernel_h);
      ParamDict::set(&local_40,2,(this->super_DeconvolutionDepthWise).dilation_w);
      ParamDict::set(&local_40,0xc,(this->super_DeconvolutionDepthWise).dilation_h);
      ParamDict::set(&local_40,3,(this->super_DeconvolutionDepthWise).stride_w);
      ParamDict::set(&local_40,0xd,(this->super_DeconvolutionDepthWise).stride_h);
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,0x12,(this->super_DeconvolutionDepthWise).output_pad_right);
      ParamDict::set(&local_40,0x13,(this->super_DeconvolutionDepthWise).output_pad_bottom);
      ParamDict::set(&local_40,5,(this->super_DeconvolutionDepthWise).bias_term);
      ParamDict::set(&local_40,6,local_e4);
      ParamDict::set(&local_40,9,(this->super_DeconvolutionDepthWise).activation_type);
      ParamDict::set(&local_40,10,local_68);
      (*pLVar8->_vptr_Layer[2])(pLVar8,&local_40);
      local_178.refcount._0_4_ = SUB84(local_b8.refcount,0);
      local_178.refcount._4_4_ = (undefined4)((ulong)local_b8.refcount >> 0x20);
      local_178.dims = local_b8.dims;
      local_178.w = local_b8.w;
      if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        local_178.data = local_b8.data;
        local_178.elemsize = local_b8.elemsize;
        local_178.elempack = local_b8.elempack;
        local_178.allocator = local_b8.allocator;
        local_178.h = local_b8.h;
        local_178.d = local_b8.d;
        local_178.c = local_b8.c;
        local_178.cstep = local_b8.cstep;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
        (*pLVar8->_vptr_Layer[3])(pLVar8,&local_50);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
        piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if (local_178.data != (void *)0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        local_178.cstep = local_b8.cstep;
        local_178.c = local_b8.c;
        local_178.h = local_b8.h;
        local_178.d = local_b8.d;
        local_178.allocator = local_b8.allocator;
        local_178.elempack = local_b8.elempack;
        local_178.elemsize = local_b8.elemsize;
        local_178.data = local_b8.data;
        uStack_128 = 0;
        uStack_124 = 0;
        sStack_120 = local_c8;
        iStack_118 = local_17c;
        local_110 = local_d0;
        uStack_104 = (undefined4)local_c0;
        local_f0 = local_d8;
        local_130 = pvVar12;
        local_108 = uVar10;
        uStack_100 = uVar10;
        uStack_fc = uVar10;
        uStack_f8 = uVar10;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
        (*pLVar8->_vptr_Layer[3])(pLVar8,&local_50);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
        lVar13 = 0x48;
        do {
          piVar4 = *(int **)((long)&local_178.refcount + lVar13);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar12 = *(void **)((long)&local_178.data + lVar13);
              plVar5 = *(long **)((long)&local_178.allocator + lVar13);
              if (plVar5 == (long *)0x0) {
                if (pvVar12 != (void *)0x0) {
                  free(pvVar12);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_178.cstep + lVar13) = 0;
          *(undefined8 *)((long)&local_178.refcount + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_178.elemsize + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_178.data + lVar13) = 0;
          *(undefined8 *)((long)&local_178.refcount + lVar13) = 0;
          *(undefined8 *)((long)&local_178.dims + lVar13) = 0;
          *(undefined8 *)((long)&local_178.h + lVar13) = 0;
          *(undefined4 *)((long)&local_178.c + lVar13) = 0;
          lVar13 = lVar13 + -0x48;
        } while (lVar13 != -0x48);
      }
      (*pLVar8->_vptr_Layer[4])(pLVar8,local_58);
      (local_e0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar14] = pLVar8;
      ParamDict::~ParamDict(&local_40);
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->super_DeconvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::create_group_ops(const Option& opt)
{
    // create Deconvolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(18, output_pad_right);
        pd.set(19, output_pad_bottom);
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}